

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

bool __thiscall cmsys::RegularExpression::operator==(RegularExpression *this,RegularExpression *rxp)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  if (this == rxp) {
    return true;
  }
  if (this->progsize == rxp->progsize) {
    lVar3 = (long)this->progsize;
    do {
      bVar4 = lVar3 == 0;
      if (bVar4) {
        return bVar4;
      }
      lVar1 = lVar3 + -1;
      lVar2 = lVar3 + -1;
      lVar3 = lVar3 + -1;
    } while (this->program[lVar1] == rxp->program[lVar2]);
    return bVar4;
  }
  return false;
}

Assistant:

bool RegularExpression::operator== (const RegularExpression& rxp) const {
  if (this != &rxp) {                           // Same address?
    int ind = this->progsize;                   // Get regular expression size
    if (ind != rxp.progsize)                    // If different size regexp
      return false;                             // Return failure
    while(ind-- != 0)                           // Else while still characters
      if(this->program[ind] != rxp.program[ind]) // If regexp are different
        return false;                            // Return failure
  }
  return true;                                  // Else same, return success
}